

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialIntegerAttributeDecoder::DecodeValues
          (SequentialIntegerAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  pointer pPVar4;
  ulong uVar5;
  size_type sVar6;
  PointCloudDecoder *pPVar7;
  undefined8 in_RDX;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_RSI;
  SequentialAttributeDecoder *in_RDI;
  int32_t num_values;
  int8_t prediction_transform_type;
  int8_t prediction_scheme_method;
  unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 local_30 [14];
  char local_22;
  char local_21;
  undefined8 local_20;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = DecoderBuffer::Decode<signed_char>
                    ((DecoderBuffer *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (char *)in_RDI);
  if (!bVar1) {
    return false;
  }
  if (local_21 != -2) {
    bVar1 = DecoderBuffer::Decode<signed_char>
                      ((DecoderBuffer *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),(char *)in_RDI)
    ;
    if (!bVar1) {
      return false;
    }
    if ((local_22 < -1) || ('\x03' < local_22)) {
      return false;
    }
    (*(code *)(((__uniq_ptr_data<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>,_true,_true>
                 *)&in_RDI->_vptr_SequentialAttributeDecoder)->
              super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
              )._M_t.
              super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
              .
              super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>
              ._M_head_impl[10].super_PredictionSchemeDecoderInterface.
              super_PredictionSchemeInterface)(local_30,in_RDI,(int)local_21,(int)local_22);
    std::
    unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
    ::operator=((unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                 *)in_RDI,in_stack_ffffffffffffffb8);
    std::
    unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
    ::~unique_ptr((unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                   *)in_RDI);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                      *)0x20a154);
  if (bVar1) {
    pPVar4 = std::
             unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
             ::get((unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                    *)in_RDI);
    uVar5 = (*(code *)(((__uniq_ptr_data<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>,_true,_true>
                         *)&in_RDI->_vptr_SequentialAttributeDecoder)->
                      super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                      )._M_t.
                      super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                      .
                      super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>
                      ._M_head_impl[7].super_PredictionSchemeDecoderInterface.
                      super_PredictionSchemeInterface)(in_RDI,pPVar4);
    if ((uVar5 & 1) == 0) {
      return false;
    }
  }
  uVar5 = (*(code *)(((__uniq_ptr_data<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>,_true,_true>
                       *)&in_RDI->_vptr_SequentialAttributeDecoder)->
                    super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                    .
                    super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>
                    ._M_head_impl[9].super_PredictionSchemeDecoderInterface.
                    super_PredictionSchemeInterface)(in_RDI,local_18,local_20);
  if ((uVar5 & 1) == 0) {
    local_1 = false;
  }
  else {
    sVar6 = std::
            vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
            ::size(local_18);
    uVar3 = (uint)sVar6;
    pPVar7 = SequentialAttributeDecoder::decoder(in_RDI);
    if (pPVar7 != (PointCloudDecoder *)0x0) {
      pPVar7 = SequentialAttributeDecoder::decoder(in_RDI);
      uVar2 = PointCloudDecoder::bitstream_version(pPVar7);
      if ((uVar2 < 0x200) &&
         (uVar3 = (*in_RDI->_vptr_SequentialAttributeDecoder[0xc])(in_RDI,(ulong)uVar3),
         (uVar3 & 1) == 0)) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SequentialIntegerAttributeDecoder::DecodeValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  // Decode prediction scheme.
  int8_t prediction_scheme_method;
  if (!in_buffer->Decode(&prediction_scheme_method)) {
    return false;
  }
  if (prediction_scheme_method != PREDICTION_NONE) {
    int8_t prediction_transform_type;
    if (!in_buffer->Decode(&prediction_transform_type)) {
      return false;
    }
    // Check that decoded prediction scheme transform type is valid.
    if (prediction_transform_type < PREDICTION_TRANSFORM_NONE ||
        prediction_transform_type >= NUM_PREDICTION_SCHEME_TRANSFORM_TYPES) {
      return false;
    }
    prediction_scheme_ = CreateIntPredictionScheme(
        static_cast<PredictionSchemeMethod>(prediction_scheme_method),
        static_cast<PredictionSchemeTransformType>(prediction_transform_type));
  }

  if (prediction_scheme_) {
    if (!InitPredictionScheme(prediction_scheme_.get())) {
      return false;
    }
  }

  if (!DecodeIntegerValues(point_ids, in_buffer)) {
    return false;
  }

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  const int32_t num_values = static_cast<uint32_t>(point_ids.size());
  if (decoder() &&
      decoder()->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    // For older files, revert the transform right after we decode the data.
    if (!StoreValues(num_values)) {
      return false;
    }
  }
#endif
  return true;
}